

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

QRhiShaderResourceBinding *
QRhiShaderResourceBinding::uniformBufferWithDynamicOffset
          (QRhiShaderResourceBinding *__return_storage_ptr__,int binding,StageFlags stage,
          QRhiBuffer *buf,quint32 size)

{
  memset(&(__return_storage_ptr__->d).type,0xaa,0x110);
  (__return_storage_ptr__->d).binding = binding;
  (__return_storage_ptr__->d).stage.
  super_QFlagsStorageHelper<QRhiShaderResourceBinding::StageFlag,_4>.
  super_QFlagsStorage<QRhiShaderResourceBinding::StageFlag>.i =
       (Int)stage.super_QFlagsStorageHelper<QRhiShaderResourceBinding::StageFlag,_4>.
            super_QFlagsStorage<QRhiShaderResourceBinding::StageFlag>.i;
  (__return_storage_ptr__->d).type = UniformBuffer;
  (__return_storage_ptr__->d).u.ubuf.buf = buf;
  (__return_storage_ptr__->d).u.ubuf.offset = 0;
  (__return_storage_ptr__->d).u.ubuf.maybeSize = size;
  (__return_storage_ptr__->d).u.ubuf.hasDynamicOffset = true;
  return __return_storage_ptr__;
}

Assistant:

QRhiShaderResourceBinding QRhiShaderResourceBinding::uniformBufferWithDynamicOffset(
        int binding, StageFlags stage, QRhiBuffer *buf, quint32 size)
{
    Q_ASSERT(size > 0);
    QRhiShaderResourceBinding b;
    b.d.binding = binding;
    b.d.stage = stage;
    b.d.type = UniformBuffer;
    b.d.u.ubuf.buf = buf;
    b.d.u.ubuf.offset = 0;
    b.d.u.ubuf.maybeSize = size;
    b.d.u.ubuf.hasDynamicOffset = true;
    return b;
}